

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

int Acb_NtkCreateNode(Acb_Ntk_t *p,word uTruth,Vec_Int_t *vSupp)

{
  uint iObj;
  Vec_Que_t *pVVar1;
  size_t __size;
  char *pcVar2;
  word *pwVar3;
  float *pfVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  iVar8 = vSupp->nSize;
  iObj = (p->vObjType).nSize;
  uVar7 = (ulong)iObj;
  uVar5 = iObj;
  if (iObj == (p->vObjType).nCap) {
    if ((int)iObj < 0x10) {
      pcVar2 = (p->vObjType).pArray;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = (char *)malloc(0x10);
      }
      else {
        pcVar2 = (char *)realloc(pcVar2,0x10);
        uVar5 = (p->vObjType).nSize;
      }
      (p->vObjType).pArray = pcVar2;
      (p->vObjType).nCap = 0x10;
      goto LAB_0038620d;
    }
    __size = uVar7 * 2;
    pcVar2 = (p->vObjType).pArray;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = (char *)malloc(__size);
    }
    else {
      pcVar2 = (char *)realloc(pcVar2,__size);
      uVar5 = (p->vObjType).nSize;
    }
    (p->vObjType).pArray = pcVar2;
    (p->vObjType).nCap = (int)__size;
    iVar6 = uVar5 + 1;
    (p->vObjType).nSize = iVar6;
    pcVar2[(int)uVar5] = 'K';
  }
  else {
    pcVar2 = (p->vObjType).pArray;
LAB_0038620d:
    (p->vObjType).nSize = uVar5 + 1;
    pcVar2[(int)uVar5] = 'K';
    if ((int)iObj < 1) {
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                    ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
    }
    iVar6 = (p->vObjType).nSize;
  }
  if ((int)iObj < iVar6) {
    iVar8 = iVar8 + (uint)((p->vObjType).pArray[uVar7] == '\x06');
    if (iVar8 <= p->nFaninMax) {
      iVar8 = p->nFaninMax;
    }
    Vec_IntPush(&p->vObjFans,(p->vFanSto).nSize);
    Vec_IntPush(&p->vFanSto,0);
    if (0 < iVar8) {
      do {
        Vec_IntPush(&p->vFanSto,-1);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    if ((int)iObj < (p->vObjType).nSize) {
      if ((p->vObjType).pArray[uVar7] == '\x06') {
        __assert_fail("!Acb_ObjIsBox(p, iObj) || nFons > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x1e7,"int Acb_ObjAlloc(Acb_Ntk_t *, Acb_ObjType_t, int, int)");
      }
      if (0 < (p->vObjCopy).nSize) {
        Vec_IntPush(&p->vObjCopy,-1);
      }
      if (0 < (p->vObjFunc).nSize) {
        Vec_IntPush(&p->vObjFunc,-1);
      }
      if (0 < (p->vObjWeight).nSize) {
        Vec_IntPush(&p->vObjWeight,0);
      }
      uVar5 = (p->vObjTruth).nSize;
      if (0 < (int)uVar5) {
        if (uVar5 == (p->vObjTruth).nCap) {
          if (uVar5 < 0x10) {
            pwVar3 = (p->vObjTruth).pArray;
            if (pwVar3 == (word *)0x0) {
              pwVar3 = (word *)malloc(0x80);
            }
            else {
              pwVar3 = (word *)realloc(pwVar3,0x80);
            }
            (p->vObjTruth).pArray = pwVar3;
            if (pwVar3 == (word *)0x0) {
LAB_003866bf:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            (p->vObjTruth).nCap = 0x10;
          }
          else {
            pwVar3 = (p->vObjTruth).pArray;
            if (pwVar3 == (word *)0x0) {
              pwVar3 = (word *)malloc((ulong)uVar5 << 4);
            }
            else {
              pwVar3 = (word *)realloc(pwVar3,(ulong)uVar5 << 4);
            }
            (p->vObjTruth).pArray = pwVar3;
            if (pwVar3 == (word *)0x0) goto LAB_003866bf;
            (p->vObjTruth).nCap = uVar5 * 2;
          }
        }
        else {
          pwVar3 = (p->vObjTruth).pArray;
        }
        iVar8 = (p->vObjTruth).nSize;
        (p->vObjTruth).nSize = iVar8 + 1;
        pwVar3[iVar8] = 0;
      }
      if (0 < (p->vObjName).nSize) {
        Vec_IntPush(&p->vObjName,0);
      }
      if (0 < (p->vObjRange).nSize) {
        Vec_IntPush(&p->vObjRange,0);
      }
      if (0 < (p->vObjTrav).nSize) {
        Vec_IntPush(&p->vObjTrav,0);
      }
      if (0 < (p->vObjAttr).nSize) {
        Vec_IntPush(&p->vObjAttr,0);
      }
      if (0 < (p->vLevelD).nSize) {
        Vec_IntPush(&p->vLevelD,0);
      }
      if (0 < (p->vLevelR).nSize) {
        Vec_IntPush(&p->vLevelR,0);
      }
      if (0 < (p->vPathD).nSize) {
        Vec_IntPush(&p->vPathD,0);
      }
      if (0 < (p->vPathR).nSize) {
        Vec_IntPush(&p->vPathR,0);
      }
      uVar5 = (p->vCounts).nSize;
      if (0 < (int)uVar5) {
        if (uVar5 == (p->vCounts).nCap) {
          if (uVar5 < 0x10) {
            pfVar4 = (p->vCounts).pArray;
            if (pfVar4 == (float *)0x0) {
              pfVar4 = (float *)malloc(0x40);
            }
            else {
              pfVar4 = (float *)realloc(pfVar4,0x40);
            }
            (p->vCounts).pArray = pfVar4;
            (p->vCounts).nCap = 0x10;
          }
          else {
            pfVar4 = (p->vCounts).pArray;
            if (pfVar4 == (float *)0x0) {
              pfVar4 = (float *)malloc((ulong)uVar5 << 3);
            }
            else {
              pfVar4 = (float *)realloc(pfVar4,(ulong)uVar5 << 3);
            }
            (p->vCounts).pArray = pfVar4;
            (p->vCounts).nCap = uVar5 * 2;
          }
        }
        else {
          pfVar4 = (p->vCounts).pArray;
        }
        iVar8 = (p->vCounts).nSize;
        (p->vCounts).nSize = iVar8 + 1;
        pfVar4[iVar8] = 0.0;
      }
      if (0 < (p->vFanouts).nSize) {
        Vec_WecPushLevel(&p->vFanouts);
      }
      if (0 < (p->vCnfs).nSize) {
        Vec_WecPushLevel(&p->vCnfs);
      }
      pVVar1 = p->vQue;
      if (pVVar1 != (Vec_Que_t *)0x0) {
        if (pVVar1->pCostsFlt != (float **)0x0) {
          __assert_fail("p->pCostsFlt == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                        ,0x61,"void Vec_QueSetPriority(Vec_Que_t *, float **)");
        }
        pVVar1->pCostsFlt = &(p->vCounts).pArray;
      }
      if ((int)iObj < 1) {
        pcVar2 = "i>0";
      }
      else {
        uVar5 = (p->vObjTruth).nSize;
        if (0 < (int)uVar5) {
          if (uVar5 <= iObj) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                          ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
          }
          pwVar3 = (p->vObjTruth).pArray;
          if (pwVar3[uVar7] == 0) {
            pwVar3[uVar7] = uTruth;
            Acb_ObjAddFanins(p,iObj,vSupp);
            Acb_ObjAddFaninFanout(p,iObj);
            Acb_ObjComputeLevelD(p,iObj);
            return iObj;
          }
          __assert_fail("Acb_ObjTruth(p, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                        ,0x11d,"void Acb_ObjSetTruth(Acb_Ntk_t *, int, word)");
        }
        pcVar2 = "Acb_NtkHasObjTruths(p)";
      }
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                    ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

int Acb_NtkCreateNode( Acb_Ntk_t * p, word uTruth, Vec_Int_t * vSupp )
{
    int Pivot = Acb_ObjAlloc( p, ABC_OPER_LUT, Vec_IntSize(vSupp), 0 );
    Acb_ObjSetTruth( p, Pivot, uTruth );
    Acb_ObjAddFanins( p, Pivot, vSupp );
    Acb_ObjAddFaninFanout( p, Pivot );
    Acb_ObjComputeLevelD( p, Pivot );
    return Pivot;
}